

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict * __thiscall
kj::ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::operator=
          (ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *this,
          ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict *other
          )

{
  Entry *pEVar1;
  RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *pRVar2;
  Entry *pEVar3;
  
  pEVar1 = this->ptr;
  if (pEVar1 != (Entry *)0x0) {
    pRVar2 = this->pos;
    pEVar3 = this->endPtr;
    this->ptr = (Entry *)0x0;
    this->pos = (RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)0x0;
    this->endPtr = (Entry *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pEVar1,0x10,(long)pRVar2 - (long)pEVar1 >> 4,
               (long)pEVar3 - (long)pEVar1 >> 4,0);
  }
  this->ptr = (Entry *)other->ptr;
  this->pos = (RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)
              other->pos;
  this->endPtr = (Entry *)other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Entry *)0x0;
  other->pos = (RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict *
               )0x0;
  other->endPtr = (Entry *)0x0;
  return (ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict *)this
  ;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }